

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

float If_CutPowerRefed(If_Man_t *p,If_Cut_t *pCut,If_Obj_t *pRoot)

{
  float fVar1;
  float fVar2;
  
  fVar1 = 0.0;
  if (0x1ffffff < *(uint *)&pCut->field_0x1c) {
    fVar2 = If_CutPowerDeref(p,pCut,pRoot);
    fVar1 = If_CutPowerRef(p,pCut,pRoot);
    if (fVar1 <= fVar2 - p->fEpsilon) {
      __assert_fail("aResult > aResult2 - p->fEpsilon",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                    ,0x538,"float If_CutPowerRefed(If_Man_t *, If_Cut_t *, If_Obj_t *)");
    }
    if (fVar2 + p->fEpsilon <= fVar1) {
      __assert_fail("aResult < aResult2 + p->fEpsilon",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                    ,0x539,"float If_CutPowerRefed(If_Man_t *, If_Cut_t *, If_Obj_t *)");
    }
  }
  return fVar1;
}

Assistant:

float If_CutPowerRefed( If_Man_t * p, If_Cut_t * pCut, If_Obj_t * pRoot )
{
    float aResult, aResult2;
    if ( pCut->nLeaves < 2 )
        return 0;
    aResult2 = If_CutPowerDeref( p, pCut, pRoot );
    aResult  = If_CutPowerRef( p, pCut, pRoot );
    assert( aResult > aResult2 - p->fEpsilon );
    assert( aResult < aResult2 + p->fEpsilon );
    return aResult;
}